

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O1

bool __thiscall Catch::TestSpec::Filter::matches(Filter *this,TestCaseInfo *testCase)

{
  pointer puVar1;
  Pattern *pPVar2;
  int iVar3;
  unique_ptr<Catch::TestSpec::Pattern> *pattern;
  pointer puVar4;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1;
  unique_ptr<Catch::TestSpec::Pattern> *pattern_1;
  bool bVar5;
  bool bVar6;
  
  bVar5 = (testCase->properties & IsHidden) == None;
  puVar1 = (this->m_required).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->m_required).
                super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_start; bVar6 = puVar4 != puVar1, bVar6;
      puVar4 = puVar4 + 1) {
    pPVar2 = puVar4->m_ptr;
    if (pPVar2 == (Pattern *)0x0) goto LAB_00128a6b;
    iVar3 = (*pPVar2->_vptr_Pattern[2])(pPVar2,testCase);
    bVar5 = true;
    if ((char)iVar3 == '\0') break;
  }
  if (bVar6) {
LAB_00128a58:
    bVar5 = false;
  }
  else {
    puVar1 = (this->m_forbidden).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (this->m_forbidden).
                  super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1)
    {
      pPVar2 = puVar4->m_ptr;
      if (pPVar2 == (Pattern *)0x0) {
LAB_00128a6b:
        __assert_fail("m_ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                      ,0x389,
                      "const T *Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>::operator->() const [T = Catch::TestSpec::Pattern]"
                     );
      }
      iVar3 = (*pPVar2->_vptr_Pattern[2])(pPVar2,testCase);
      if ((char)iVar3 != '\0') goto LAB_00128a58;
    }
  }
  return bVar5;
}

Assistant:

bool TestSpec::Filter::matches( TestCaseInfo const& testCase ) const {
        bool should_use = !testCase.isHidden();
        for (auto const& pattern : m_required) {
            should_use = true;
            if (!pattern->matches(testCase)) {
                return false;
            }
        }
        for (auto const& pattern : m_forbidden) {
            if (pattern->matches(testCase)) {
                return false;
            }
        }
        return should_use;
    }